

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> __thiscall
enact::Parser::expectTypenamePrecParametric(Parser *this,string *msg,bool emptyAllowed)

{
  string *this_00;
  long *plVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  allocator<char> local_79;
  undefined1 local_78 [16];
  string local_68;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  parameterTypenames;
  
  expectTypenamePrecPrimary(this,msg,emptyAllowed);
  bVar3 = consume((Parser *)msg,LEFT_SQUARE);
  if (bVar3) {
    parameterTypenames.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parameterTypenames.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    parameterTypenames.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = (string *)(local_78 + 0x10);
    local_78._8_8_ = this;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,"Expected typename parameters after \'[\'.",&local_79);
      expectTypenamePrecFunction((Parser *)local_78,msg,SUB81(this_00,0));
      std::
      vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
      ::
      emplace_back<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>
                ((vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
                  *)&parameterTypenames,
                 (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
                 local_78);
      if ((CompileContext *)local_78._0_8_ != (CompileContext *)0x0) {
        (**(code **)((((string *)local_78._0_8_)->_M_dataplus)._M_p + 8))();
      }
      local_78._0_8_ = (CompileContext *)0x0;
      std::__cxx11::string::~string(this_00);
      bVar3 = consume((Parser *)msg,COMMA);
    } while (bVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_78 + 0x10),"Expected \']\' after typename parameters.",
               (allocator<char> *)local_78);
    this = (Parser *)local_78._8_8_;
    expect((Parser *)msg,RIGHT_SQUARE,(string *)(local_78 + 0x10));
    std::__cxx11::string::~string((string *)(local_78 + 0x10));
    std::
    make_unique<enact::ParametricTypename,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>>
              ((unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               (local_78 + 0x10),
               (vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                *)this);
    _Var2._M_p = local_68._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)0x0;
    plVar1 = *(long **)this;
    *(pointer *)this = _Var2._M_p;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
      if ((long *)local_68._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_68._M_dataplus._M_p + 8))();
      }
    }
    std::
    vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ::~vector(&parameterTypenames);
  }
  return (__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
          )(tuple<const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>)this;
}

Assistant:

std::unique_ptr<const Typename> Parser::expectTypenamePrecParametric(const std::string &msg, bool emptyAllowed) {
        std::unique_ptr<const Typename> typename_ = expectTypenamePrecPrimary(msg, emptyAllowed);

        if (consume(TokenType::LEFT_SQUARE)) {
            std::vector<std::unique_ptr<const Typename>> parameterTypenames;

            do {
                parameterTypenames.push_back(expectTypename("Expected typename parameters after '['."));
            } while (consume(TokenType::COMMA));
            expect(TokenType::RIGHT_SQUARE, "Expected ']' after typename parameters.");

            typename_ = std::make_unique<ParametricTypename>(std::move(typename_), std::move(parameterTypenames));
        }

        return typename_;
    }